

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementBeamANCF_3333.cpp
# Opt level: O1

void __thiscall
chrono::fea::ChElementBeamANCF_3333::ComputeInternalJacobianPreInt
          (ChElementBeamANCF_3333 *this,ChMatrixRef *H,double Kfactor,double Rfactor,double Mfactor)

{
  Matrix<double,__1,__1,_0,__1,__1> *a_rhs;
  PointerType pdVar1;
  long lVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  ulong uVar6;
  char *__function;
  int iVar7;
  double *pdVar8;
  double *pdVar9;
  long lVar10;
  long lVar11;
  ulong uVar12;
  long lVar13;
  ulong uVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  long lVar18;
  uint v;
  uint uVar19;
  long lVar20;
  undefined1 auVar21 [16];
  double dVar22;
  undefined8 in_XMM0_Qb;
  undefined1 auVar23 [16];
  undefined8 in_XMM1_Qb;
  double dVar24;
  ChVectorN<double,_(NSF_*_(NSF___1))___2>_conflict1 ScaledMassMatrix;
  MatrixNxN K_K13Compact;
  ChMatrixNM<double,_1,_NSF>_conflict1 tempRow2;
  ChMatrixNM<double,_1,_NSF>_conflict1 tempRow1;
  ChMatrixNM<double,_1,_NSF>_conflict1 tempRow0;
  Matrix3xN e_bar;
  Matrix3xN e_bar_dot;
  ChMatrixNMc<double,_9,_NSF_*_NSF> K2;
  ChMatrixNMc<double,_9,_NSF_*_NSF> PI2;
  variable_if_dynamic<long,__1> *local_34e8;
  Scalar local_3458;
  double dStack_3450;
  double local_3448;
  double dStack_3440;
  double local_3438;
  double dStack_3430;
  double local_3428;
  double dStack_3420;
  double local_3418;
  double dStack_3410;
  double local_3408;
  double dStack_3400;
  double local_33f8;
  double dStack_33f0;
  double local_33e8;
  double dStack_33e0;
  double local_33d8;
  double dStack_33d0;
  double local_33c8;
  double dStack_33c0;
  double local_33b8;
  double dStack_33b0;
  double local_33a8;
  double dStack_33a0;
  double local_3398;
  double dStack_3390;
  double local_3388;
  double dStack_3380;
  double local_3378;
  double dStack_3370;
  double local_3368;
  double dStack_3360;
  double local_3358;
  double dStack_3350;
  double local_3348;
  double dStack_3340;
  double local_3338;
  double dStack_3330;
  double local_3328;
  double dStack_3320;
  double local_3318;
  double dStack_3310;
  double local_3308;
  double dStack_3300;
  double local_32f8;
  Block<Eigen::Matrix<double,_9,_81,_0,_9,_81>,_3,_9,_false> local_32f0;
  double local_32b0 [73];
  Matrix<double,_1,_9,_1,_1,_9> local_3068;
  Matrix<double,_1,_9,_1,_1,_9> local_3018;
  Matrix<double,_1,_9,_1,_1,_9> local_2fc8;
  Matrix<double,_3,_9,_1,_3,_9> local_2f78;
  Matrix3xN local_2e98;
  Matrix<double,_9,_81,_0,_9,_81> local_2dc0;
  Matrix<double,_9,_81,_0,_9,_81> local_16f8;
  
  pdVar8 = (double *)&local_2f78;
  CalcCoordMatrix(this,(Matrix3xN *)pdVar8);
  CalcCoordDerivMatrix(this,&local_2e98);
  auVar23._8_8_ = 0;
  auVar23._0_8_ = this->m_Alpha;
  auVar5._8_8_ = in_XMM1_Qb;
  auVar5._0_8_ = Rfactor;
  auVar21._8_8_ = in_XMM0_Qb;
  auVar21._0_8_ = Kfactor;
  auVar21 = vfmadd213sd_fma(auVar5,auVar23,auVar21);
  dVar22 = this->m_Alpha * Kfactor;
  dVar24 = auVar21._0_8_;
  local_2fc8.super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>.m_storage.m_data.array[0]
       = dVar24 * local_2f78.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_1,_3,_9>_>.m_storage.
                  m_data.array[0] +
         dVar22 * local_2e98.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_1,_3,_9>_>.m_storage.
                  m_data.array[0];
  local_2fc8.super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>.m_storage.m_data.array[1]
       = dVar24 * local_2f78.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_1,_3,_9>_>.m_storage.
                  m_data.array[1] +
         dVar22 * local_2e98.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_1,_3,_9>_>.m_storage.
                  m_data.array[1];
  local_2fc8.super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>.m_storage.m_data.array[2]
       = dVar24 * local_2f78.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_1,_3,_9>_>.m_storage.
                  m_data.array[2] +
         dVar22 * local_2e98.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_1,_3,_9>_>.m_storage.
                  m_data.array[2];
  local_2fc8.super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>.m_storage.m_data.array[3]
       = dVar24 * local_2f78.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_1,_3,_9>_>.m_storage.
                  m_data.array[3] +
         dVar22 * local_2e98.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_1,_3,_9>_>.m_storage.
                  m_data.array[3];
  local_2fc8.super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>.m_storage.m_data.array[4]
       = dVar24 * local_2f78.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_1,_3,_9>_>.m_storage.
                  m_data.array[4] +
         dVar22 * local_2e98.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_1,_3,_9>_>.m_storage.
                  m_data.array[4];
  local_2fc8.super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>.m_storage.m_data.array[5]
       = dVar24 * local_2f78.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_1,_3,_9>_>.m_storage.
                  m_data.array[5] +
         dVar22 * local_2e98.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_1,_3,_9>_>.m_storage.
                  m_data.array[5];
  local_2fc8.super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>.m_storage.m_data.array[6]
       = dVar24 * local_2f78.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_1,_3,_9>_>.m_storage.
                  m_data.array[6] +
         dVar22 * local_2e98.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_1,_3,_9>_>.m_storage.
                  m_data.array[6];
  local_2fc8.super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>.m_storage.m_data.array[7]
       = dVar24 * local_2f78.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_1,_3,_9>_>.m_storage.
                  m_data.array[7] +
         dVar22 * local_2e98.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_1,_3,_9>_>.m_storage.
                  m_data.array[7];
  local_2fc8.super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>.m_storage.m_data.array[8]
       = dVar22 * local_2e98.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_1,_3,_9>_>.m_storage.
                  m_data.array[8] +
         dVar24 * local_2f78.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_1,_3,_9>_>.m_storage.
                  m_data.array[8];
  local_3018.super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>.m_storage.m_data.array[0]
       = dVar22 * local_2e98.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_1,_3,_9>_>.m_storage.
                  m_data.array[9] +
         dVar24 * local_2f78.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_1,_3,_9>_>.m_storage.
                  m_data.array[9];
  local_3018.super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>.m_storage.m_data.array[1]
       = dVar22 * local_2e98.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_1,_3,_9>_>.m_storage.
                  m_data.array[10] +
         dVar24 * local_2f78.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_1,_3,_9>_>.m_storage.
                  m_data.array[10];
  local_3018.super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>.m_storage.m_data.array[2]
       = dVar22 * local_2e98.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_1,_3,_9>_>.m_storage.
                  m_data.array[0xb] +
         dVar24 * local_2f78.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_1,_3,_9>_>.m_storage.
                  m_data.array[0xb];
  local_3018.super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>.m_storage.m_data.array[3]
       = dVar22 * local_2e98.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_1,_3,_9>_>.m_storage.
                  m_data.array[0xc] +
         dVar24 * local_2f78.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_1,_3,_9>_>.m_storage.
                  m_data.array[0xc];
  local_3018.super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>.m_storage.m_data.array[4]
       = dVar22 * local_2e98.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_1,_3,_9>_>.m_storage.
                  m_data.array[0xd] +
         dVar24 * local_2f78.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_1,_3,_9>_>.m_storage.
                  m_data.array[0xd];
  local_3018.super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>.m_storage.m_data.array[5]
       = dVar22 * local_2e98.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_1,_3,_9>_>.m_storage.
                  m_data.array[0xe] +
         dVar24 * local_2f78.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_1,_3,_9>_>.m_storage.
                  m_data.array[0xe];
  local_3018.super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>.m_storage.m_data.array[6]
       = dVar22 * local_2e98.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_1,_3,_9>_>.m_storage.
                  m_data.array[0xf] +
         dVar24 * local_2f78.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_1,_3,_9>_>.m_storage.
                  m_data.array[0xf];
  local_3018.super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>.m_storage.m_data.array[7]
       = dVar22 * local_2e98.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_1,_3,_9>_>.m_storage.
                  m_data.array[0x10] +
         dVar24 * local_2f78.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_1,_3,_9>_>.m_storage.
                  m_data.array[0x10];
  local_3018.super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>.m_storage.m_data.array[8]
       = dVar22 * local_2e98.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_1,_3,_9>_>.m_storage.
                  m_data.array[0x11] +
         dVar24 * local_2f78.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_1,_3,_9>_>.m_storage.
                  m_data.array[0x11];
  local_3068.super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>.m_storage.m_data.array[0]
       = dVar22 * local_2e98.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_1,_3,_9>_>.m_storage.
                  m_data.array[0x12] +
         dVar24 * local_2f78.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_1,_3,_9>_>.m_storage.
                  m_data.array[0x12];
  local_3068.super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>.m_storage.m_data.array[1]
       = dVar22 * local_2e98.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_1,_3,_9>_>.m_storage.
                  m_data.array[0x13] +
         dVar24 * local_2f78.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_1,_3,_9>_>.m_storage.
                  m_data.array[0x13];
  local_3068.super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>.m_storage.m_data.array[2]
       = dVar24 * local_2f78.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_1,_3,_9>_>.m_storage.
                  m_data.array[0x14] +
         dVar22 * local_2e98.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_1,_3,_9>_>.m_storage.
                  m_data.array[0x14];
  local_3068.super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>.m_storage.m_data.array[3]
       = dVar24 * local_2f78.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_1,_3,_9>_>.m_storage.
                  m_data.array[0x15] +
         dVar22 * local_2e98.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_1,_3,_9>_>.m_storage.
                  m_data.array[0x15];
  local_3068.super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>.m_storage.m_data.array[4]
       = dVar24 * local_2f78.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_1,_3,_9>_>.m_storage.
                  m_data.array[0x16] +
         dVar22 * local_2e98.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_1,_3,_9>_>.m_storage.
                  m_data.array[0x16];
  local_3068.super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>.m_storage.m_data.array[5]
       = dVar24 * local_2f78.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_1,_3,_9>_>.m_storage.
                  m_data.array[0x17] +
         dVar22 * local_2e98.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_1,_3,_9>_>.m_storage.
                  m_data.array[0x17];
  local_3068.super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>.m_storage.m_data.array[6]
       = dVar24 * local_2f78.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_1,_3,_9>_>.m_storage.
                  m_data.array[0x18] +
         dVar22 * local_2e98.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_1,_3,_9>_>.m_storage.
                  m_data.array[0x18];
  local_3068.super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>.m_storage.m_data.array[7]
       = dVar24 * local_2f78.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_1,_3,_9>_>.m_storage.
                  m_data.array[0x19] +
         dVar22 * local_2e98.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_1,_3,_9>_>.m_storage.
                  m_data.array[0x19];
  local_3068.super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>.m_storage.m_data.array[8]
       = dVar24 * local_2f78.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_1,_3,_9>_>.m_storage.
                  m_data.array[0x1a] +
         dVar22 * local_2e98.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_1,_3,_9>_>.m_storage.
                  m_data.array[0x1a];
  pdVar9 = (double *)&local_16f8;
  lVar17 = 0;
  lVar20 = 0;
  do {
    local_2dc0.super_PlainObjectBase<Eigen::Matrix<double,_9,_81,_0,_9,_81>_>.m_storage.m_data.array
    [2] = (double)&local_2f78;
    local_2dc0.super_PlainObjectBase<Eigen::Matrix<double,_9,_81,_0,_9,_81>_>.m_storage.m_data.array
    [3] = 0.0;
    local_2dc0.super_PlainObjectBase<Eigen::Matrix<double,_9,_81,_0,_9,_81>_>.m_storage.m_data.array
    [5] = 4.94065645841247e-324;
    local_2dc0.super_PlainObjectBase<Eigen::Matrix<double,_9,_81,_0,_9,_81>_>.m_storage.m_data.array
    [6] = (double)&local_2fc8;
    local_32f0.super_BlockImpl<Eigen::Matrix<double,_9,_81,_0,_9,_81>,_3,_9,_false,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<double,_9,_81,_0,_9,_81>,_3,_9,_false,_true>.m_xpr =
         &local_16f8;
    local_32f0.super_BlockImpl<Eigen::Matrix<double,_9,_81,_0,_9,_81>,_3,_9,_false,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<double,_9,_81,_0,_9,_81>,_3,_9,_false,_true>.m_startRow.
    m_value = 0;
    local_32f0.super_BlockImpl<Eigen::Matrix<double,_9,_81,_0,_9,_81>,_3,_9,_false,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<double,_9,_81,_0,_9,_81>,_3,_9,_false,_true>.m_outerStride =
         9;
    local_32f0.super_BlockImpl<Eigen::Matrix<double,_9,_81,_0,_9,_81>,_3,_9,_false,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<double,_9,_81,_0,_9,_81>,_3,_9,_false,_true>.
    super_MapBase<Eigen::Block<Eigen::Matrix<double,_9,_81,_0,_9,_81>,_3,_9,_false>,_1>.
    super_MapBase<Eigen::Block<Eigen::Matrix<double,_9,_81,_0,_9,_81>,_3,_9,_false>,_0>.m_data =
         pdVar9;
    local_32f0.super_BlockImpl<Eigen::Matrix<double,_9,_81,_0,_9,_81>,_3,_9,_false,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<double,_9,_81,_0,_9,_81>,_3,_9,_false,_true>.m_startCol.
    m_value = lVar17;
    local_2dc0.super_PlainObjectBase<Eigen::Matrix<double,_9,_81,_0,_9,_81>_>.m_storage.m_data.array
    [0] = (double)pdVar8;
    local_2dc0.super_PlainObjectBase<Eigen::Matrix<double,_9,_81,_0,_9,_81>_>.m_storage.m_data.array
    [4] = (double)lVar20;
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,9,81,0,9,81>,3,9,false>,Eigen::Product<Eigen::Block<Eigen::Matrix<double,3,9,1,3,9>,3,1,false>,Eigen::Matrix<double,1,9,1,1,9>,0>,Eigen::internal::assign_op<double,double>>
              (&local_32f0,
               (Product<Eigen::Block<Eigen::Matrix<double,_3,_9,_1,_3,_9>,_3,_1,_false>,_Eigen::Matrix<double,_1,_9,_1,_1,_9>,_0>
                *)&local_2dc0,(assign_op<double,_double> *)&local_3458,(type)0x0);
    local_2dc0.super_PlainObjectBase<Eigen::Matrix<double,_9,_81,_0,_9,_81>_>.m_storage.m_data.array
    [2] = (double)&local_2f78;
    local_2dc0.super_PlainObjectBase<Eigen::Matrix<double,_9,_81,_0,_9,_81>_>.m_storage.m_data.array
    [3] = 0.0;
    local_2dc0.super_PlainObjectBase<Eigen::Matrix<double,_9,_81,_0,_9,_81>_>.m_storage.m_data.array
    [5] = 4.94065645841247e-324;
    local_2dc0.super_PlainObjectBase<Eigen::Matrix<double,_9,_81,_0,_9,_81>_>.m_storage.m_data.array
    [6] = (double)&local_3018;
    local_32f0.super_BlockImpl<Eigen::Matrix<double,_9,_81,_0,_9,_81>,_3,_9,_false,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<double,_9,_81,_0,_9,_81>,_3,_9,_false,_true>.
    super_MapBase<Eigen::Block<Eigen::Matrix<double,_9,_81,_0,_9,_81>,_3,_9,_false>,_1>.
    super_MapBase<Eigen::Block<Eigen::Matrix<double,_9,_81,_0,_9,_81>,_3,_9,_false>,_0>.m_data =
         pdVar9 + 3;
    local_32f0.super_BlockImpl<Eigen::Matrix<double,_9,_81,_0,_9,_81>,_3,_9,_false,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<double,_9,_81,_0,_9,_81>,_3,_9,_false,_true>.m_xpr =
         &local_16f8;
    local_32f0.super_BlockImpl<Eigen::Matrix<double,_9,_81,_0,_9,_81>,_3,_9,_false,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<double,_9,_81,_0,_9,_81>,_3,_9,_false,_true>.m_startRow.
    m_value = 3;
    local_32f0.super_BlockImpl<Eigen::Matrix<double,_9,_81,_0,_9,_81>,_3,_9,_false,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<double,_9,_81,_0,_9,_81>,_3,_9,_false,_true>.m_outerStride =
         9;
    local_32f0.super_BlockImpl<Eigen::Matrix<double,_9,_81,_0,_9,_81>,_3,_9,_false,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<double,_9,_81,_0,_9,_81>,_3,_9,_false,_true>.m_startCol.
    m_value = lVar17;
    local_2dc0.super_PlainObjectBase<Eigen::Matrix<double,_9,_81,_0,_9,_81>_>.m_storage.m_data.array
    [0] = (double)pdVar8;
    local_2dc0.super_PlainObjectBase<Eigen::Matrix<double,_9,_81,_0,_9,_81>_>.m_storage.m_data.array
    [4] = (double)lVar20;
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,9,81,0,9,81>,3,9,false>,Eigen::Product<Eigen::Block<Eigen::Matrix<double,3,9,1,3,9>,3,1,false>,Eigen::Matrix<double,1,9,1,1,9>,0>,Eigen::internal::assign_op<double,double>>
              (&local_32f0,
               (Product<Eigen::Block<Eigen::Matrix<double,_3,_9,_1,_3,_9>,_3,_1,_false>,_Eigen::Matrix<double,_1,_9,_1,_1,_9>,_0>
                *)&local_2dc0,(assign_op<double,_double> *)&local_3458,(type)0x0);
    local_2dc0.super_PlainObjectBase<Eigen::Matrix<double,_9,_81,_0,_9,_81>_>.m_storage.m_data.array
    [2] = (double)&local_2f78;
    local_2dc0.super_PlainObjectBase<Eigen::Matrix<double,_9,_81,_0,_9,_81>_>.m_storage.m_data.array
    [3] = 0.0;
    local_2dc0.super_PlainObjectBase<Eigen::Matrix<double,_9,_81,_0,_9,_81>_>.m_storage.m_data.array
    [5] = 4.94065645841247e-324;
    local_2dc0.super_PlainObjectBase<Eigen::Matrix<double,_9,_81,_0,_9,_81>_>.m_storage.m_data.array
    [6] = (double)&local_3068;
    local_32f0.super_BlockImpl<Eigen::Matrix<double,_9,_81,_0,_9,_81>,_3,_9,_false,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<double,_9,_81,_0,_9,_81>,_3,_9,_false,_true>.
    super_MapBase<Eigen::Block<Eigen::Matrix<double,_9,_81,_0,_9,_81>,_3,_9,_false>,_1>.
    super_MapBase<Eigen::Block<Eigen::Matrix<double,_9,_81,_0,_9,_81>,_3,_9,_false>,_0>.m_data =
         pdVar9 + 6;
    local_32f0.super_BlockImpl<Eigen::Matrix<double,_9,_81,_0,_9,_81>,_3,_9,_false,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<double,_9,_81,_0,_9,_81>,_3,_9,_false,_true>.m_xpr =
         &local_16f8;
    local_32f0.super_BlockImpl<Eigen::Matrix<double,_9,_81,_0,_9,_81>,_3,_9,_false,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<double,_9,_81,_0,_9,_81>,_3,_9,_false,_true>.m_startRow.
    m_value = 6;
    local_32f0.super_BlockImpl<Eigen::Matrix<double,_9,_81,_0,_9,_81>,_3,_9,_false,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<double,_9,_81,_0,_9,_81>,_3,_9,_false,_true>.m_outerStride =
         9;
    local_32f0.super_BlockImpl<Eigen::Matrix<double,_9,_81,_0,_9,_81>,_3,_9,_false,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<double,_9,_81,_0,_9,_81>,_3,_9,_false,_true>.m_startCol.
    m_value = lVar17;
    local_2dc0.super_PlainObjectBase<Eigen::Matrix<double,_9,_81,_0,_9,_81>_>.m_storage.m_data.array
    [0] = (double)pdVar8;
    local_2dc0.super_PlainObjectBase<Eigen::Matrix<double,_9,_81,_0,_9,_81>_>.m_storage.m_data.array
    [4] = (double)lVar20;
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,9,81,0,9,81>,3,9,false>,Eigen::Product<Eigen::Block<Eigen::Matrix<double,3,9,1,3,9>,3,1,false>,Eigen::Matrix<double,1,9,1,1,9>,0>,Eigen::internal::assign_op<double,double>>
              (&local_32f0,
               (Product<Eigen::Block<Eigen::Matrix<double,_3,_9,_1,_3,_9>,_3,_1,_false>,_Eigen::Matrix<double,_1,_9,_1,_1,_9>,_0>
                *)&local_2dc0,(assign_op<double,_double> *)&local_3458,(type)0x0);
    lVar20 = lVar20 + 1;
    pdVar9 = pdVar9 + 0x51;
    lVar17 = lVar17 + 9;
    pdVar8 = pdVar8 + 1;
  } while (lVar20 != 9);
  a_rhs = &this->m_O2;
  local_32f0.super_BlockImpl<Eigen::Matrix<double,_9,_81,_0,_9,_81>,_3,_9,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_9,_81,_0,_9,_81>,_3,_9,_false,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_9,_81,_0,_9,_81>,_3,_9,_false>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_9,_81,_0,_9,_81>,_3,_9,_false>,_0>.m_data =
       (PointerType)&local_16f8;
  local_32f0.super_BlockImpl<Eigen::Matrix<double,_9,_81,_0,_9,_81>,_3,_9,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_9,_81,_0,_9,_81>,_3,_9,_false,_true>.m_xpr =
       (XprTypeNested)a_rhs;
  if ((this->m_O2).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows
      != 0x51) {
    __assert_fail("lhs.cols() == rhs.rows() && \"invalid matrix product\" && \"if you wanted a coeff-wise or a dot product use the respective explicit functions\""
                  ,"/usr/include/eigen3/Eigen/src/Core/Product.h",0x62,
                  "Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>, const Eigen::Matrix<double, 9, 81, 0>>, Eigen::Matrix<double, -1, -1>>::Product(const Lhs &, const Rhs &) [Lhs = Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>, const Eigen::Matrix<double, 9, 81, 0>>, Rhs = Eigen::Matrix<double, -1, -1>, Option = 0]"
                 );
  }
  if ((this->m_O2).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols
      == 0x51) {
    lVar10 = 0;
    memset(&local_2dc0,0,0x16c8);
    local_3458 = 1.0;
    local_34e8 = (variable_if_dynamic<long,__1> *)&local_32f0;
    Eigen::internal::
    generic_product_impl<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::Matrix<double,9,81,0,9,81>const>,Eigen::Matrix<double,-1,-1,0,-1,-1>,Eigen::DenseShape,Eigen::DenseShape,8>
    ::scaleAndAddTo<Eigen::Matrix<double,9,81,0,9,81>>
              (&local_2dc0,
               (CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Matrix<double,_9,_81,_0,_9,_81>_>
                *)local_34e8,a_rhs,&local_3458);
    lVar17 = 8;
    lVar20 = 0x10;
    pdVar8 = local_2dc0.super_PlainObjectBase<Eigen::Matrix<double,_9,_81,_0,_9,_81>_>.m_storage.
             m_data.array + 8;
    lVar11 = 0;
    do {
      lVar13 = (H->
               super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
               ).m_stride.m_outer.m_value;
      pdVar1 = (H->
               super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
               ).
               super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
               .
               super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
               .m_data;
      lVar2 = (H->
              super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
              ).
              super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
              .
              super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
              .m_rows.m_value;
      lVar15 = lVar13 * lVar10;
      lVar16 = lVar13 * lVar17;
      lVar13 = lVar13 * lVar20;
      lVar18 = 2;
      pdVar9 = pdVar8;
      do {
        if ((lVar2 < lVar11 * 3 + 3) ||
           ((H->
            super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
            ).
            super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
            .
            super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
            .m_cols.m_value <= lVar18 + -2)) {
LAB_00740018:
          __assert_fail("startRow >= 0 && BlockRows >= 0 && startRow + BlockRows <= xpr.rows() && startCol >= 0 && BlockCols >= 0 && startCol + BlockCols <= xpr.cols()"
                        ,"/usr/include/eigen3/Eigen/src/Core/Block.h",0x85,
                        "Eigen::Block<Eigen::Ref<Eigen::Matrix<double, -1, -1, 1>>, 3, 1>::Block(XprType &, Index, Index) [XprType = Eigen::Ref<Eigen::Matrix<double, -1, -1, 1>>, BlockRows = 3, BlockCols = 1, InnerPanel = false]"
                       );
        }
        *(double *)((long)pdVar1 + lVar18 * 8 + lVar15 + -0x10) =
             ((plain_array<double,_729,_0,_0> *)(pdVar9 + -8))->array[0];
        *(double *)((long)pdVar1 + lVar18 * 8 + lVar16 + -0x10) = pdVar9[-7];
        *(double *)((long)pdVar1 + lVar18 * 8 + lVar13 + -0x10) = pdVar9[-6];
        if ((H->
            super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
            ).
            super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
            .
            super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
            .m_cols.m_value <= lVar18 + -1) goto LAB_00740018;
        *(double *)((long)pdVar1 + lVar18 * 8 + lVar15 + -8) = pdVar9[-5];
        *(double *)((long)pdVar1 + lVar18 * 8 + lVar16 + -8) = pdVar9[-4];
        *(double *)((long)pdVar1 + lVar18 * 8 + lVar13 + -8) = pdVar9[-3];
        if ((H->
            super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
            ).
            super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
            .
            super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
            .m_cols.m_value <= lVar18) goto LAB_00740018;
        *(double *)((long)pdVar1 + lVar18 * 8 + lVar15) = pdVar9[-2];
        *(double *)((long)pdVar1 + lVar18 * 8 + lVar16) = pdVar9[-1];
        *(double *)((long)pdVar1 + lVar18 * 8 + lVar13) = *pdVar9;
        lVar18 = lVar18 + 3;
        pdVar9 = pdVar9 + 0x51;
      } while (lVar18 != 0x1d);
      lVar11 = lVar11 + 1;
      lVar10 = lVar10 + 0x18;
      lVar17 = lVar17 + 0x18;
      lVar20 = lVar20 + 0x18;
      pdVar8 = pdVar8 + 9;
    } while (lVar11 != 9);
    uVar6 = (this->m_K13Compact).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
            m_storage.m_rows;
    uVar14 = (this->m_K13Compact).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
             m_storage.m_cols;
    if ((long)(uVar14 | uVar6) < 0) {
      __assert_fail("rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols)"
                    ,"/usr/include/eigen3/Eigen/src/Core/CwiseNullaryOp.h",0x4a,
                    "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, -1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = const Eigen::Matrix<double, -1, -1>]"
                   );
    }
    if ((uVar6 == 9) && (uVar14 == 9)) {
      auVar4._8_8_ = in_XMM0_Qb;
      auVar4._0_8_ = Kfactor;
      auVar3._8_8_ = 0x8000000000000000;
      auVar3._0_8_ = 0x8000000000000000;
      auVar21 = vxorpd_avx512vl(auVar4,auVar3);
      pdVar9 = (this->m_K13Compact).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
               .m_storage.m_data;
      pdVar8 = local_32b0;
      lVar17 = 0;
      do {
        dVar22 = auVar21._0_8_;
        pdVar8[-8] = dVar22 * *(double *)((long)pdVar9 + lVar17);
        pdVar8[-7] = dVar22 * *(double *)((long)pdVar9 + lVar17 + 0x48);
        pdVar8[-6] = dVar22 * *(double *)((long)pdVar9 + lVar17 + 0x90);
        pdVar8[-5] = dVar22 * *(double *)((long)pdVar9 + lVar17 + 0xd8);
        pdVar8[-4] = dVar22 * *(double *)((long)pdVar9 + lVar17 + 0x120);
        pdVar8[-3] = dVar22 * *(double *)((long)pdVar9 + lVar17 + 0x168);
        pdVar8[-2] = dVar22 * *(double *)((long)pdVar9 + lVar17 + 0x1b0);
        pdVar8[-1] = dVar22 * *(double *)((long)pdVar9 + lVar17 + 0x1f8);
        *pdVar8 = dVar22 * *(double *)((long)pdVar9 + lVar17 + 0x240);
        lVar17 = lVar17 + 8;
        pdVar8 = pdVar8 + 9;
      } while (lVar17 != 0x48);
      local_3458 = Mfactor * (this->m_MassMatrix).
                             super_PlainObjectBase<Eigen::Matrix<double,_45,_1,_0,_45,_1>_>.
                             m_storage.m_data.array[0];
      dStack_3450 = Mfactor * (this->m_MassMatrix).
                              super_PlainObjectBase<Eigen::Matrix<double,_45,_1,_0,_45,_1>_>.
                              m_storage.m_data.array[1];
      local_3448 = Mfactor * (this->m_MassMatrix).
                             super_PlainObjectBase<Eigen::Matrix<double,_45,_1,_0,_45,_1>_>.
                             m_storage.m_data.array[2];
      dStack_3440 = Mfactor * (this->m_MassMatrix).
                              super_PlainObjectBase<Eigen::Matrix<double,_45,_1,_0,_45,_1>_>.
                              m_storage.m_data.array[3];
      local_3438 = Mfactor * (this->m_MassMatrix).
                             super_PlainObjectBase<Eigen::Matrix<double,_45,_1,_0,_45,_1>_>.
                             m_storage.m_data.array[4];
      dStack_3430 = Mfactor * (this->m_MassMatrix).
                              super_PlainObjectBase<Eigen::Matrix<double,_45,_1,_0,_45,_1>_>.
                              m_storage.m_data.array[5];
      local_3428 = Mfactor * (this->m_MassMatrix).
                             super_PlainObjectBase<Eigen::Matrix<double,_45,_1,_0,_45,_1>_>.
                             m_storage.m_data.array[6];
      dStack_3420 = Mfactor * (this->m_MassMatrix).
                              super_PlainObjectBase<Eigen::Matrix<double,_45,_1,_0,_45,_1>_>.
                              m_storage.m_data.array[7];
      local_3418 = Mfactor * (this->m_MassMatrix).
                             super_PlainObjectBase<Eigen::Matrix<double,_45,_1,_0,_45,_1>_>.
                             m_storage.m_data.array[8];
      dStack_3410 = Mfactor * (this->m_MassMatrix).
                              super_PlainObjectBase<Eigen::Matrix<double,_45,_1,_0,_45,_1>_>.
                              m_storage.m_data.array[9];
      local_3408 = Mfactor * (this->m_MassMatrix).
                             super_PlainObjectBase<Eigen::Matrix<double,_45,_1,_0,_45,_1>_>.
                             m_storage.m_data.array[10];
      dStack_3400 = Mfactor * (this->m_MassMatrix).
                              super_PlainObjectBase<Eigen::Matrix<double,_45,_1,_0,_45,_1>_>.
                              m_storage.m_data.array[0xb];
      local_33f8 = Mfactor * (this->m_MassMatrix).
                             super_PlainObjectBase<Eigen::Matrix<double,_45,_1,_0,_45,_1>_>.
                             m_storage.m_data.array[0xc];
      dStack_33f0 = Mfactor * (this->m_MassMatrix).
                              super_PlainObjectBase<Eigen::Matrix<double,_45,_1,_0,_45,_1>_>.
                              m_storage.m_data.array[0xd];
      local_33e8 = Mfactor * (this->m_MassMatrix).
                             super_PlainObjectBase<Eigen::Matrix<double,_45,_1,_0,_45,_1>_>.
                             m_storage.m_data.array[0xe];
      dStack_33e0 = Mfactor * (this->m_MassMatrix).
                              super_PlainObjectBase<Eigen::Matrix<double,_45,_1,_0,_45,_1>_>.
                              m_storage.m_data.array[0xf];
      local_33d8 = Mfactor * (this->m_MassMatrix).
                             super_PlainObjectBase<Eigen::Matrix<double,_45,_1,_0,_45,_1>_>.
                             m_storage.m_data.array[0x10];
      dStack_33d0 = Mfactor * (this->m_MassMatrix).
                              super_PlainObjectBase<Eigen::Matrix<double,_45,_1,_0,_45,_1>_>.
                              m_storage.m_data.array[0x11];
      local_33c8 = Mfactor * (this->m_MassMatrix).
                             super_PlainObjectBase<Eigen::Matrix<double,_45,_1,_0,_45,_1>_>.
                             m_storage.m_data.array[0x12];
      dStack_33c0 = Mfactor * (this->m_MassMatrix).
                              super_PlainObjectBase<Eigen::Matrix<double,_45,_1,_0,_45,_1>_>.
                              m_storage.m_data.array[0x13];
      local_33b8 = Mfactor * (this->m_MassMatrix).
                             super_PlainObjectBase<Eigen::Matrix<double,_45,_1,_0,_45,_1>_>.
                             m_storage.m_data.array[0x14];
      dStack_33b0 = Mfactor * (this->m_MassMatrix).
                              super_PlainObjectBase<Eigen::Matrix<double,_45,_1,_0,_45,_1>_>.
                              m_storage.m_data.array[0x15];
      local_33a8 = Mfactor * (this->m_MassMatrix).
                             super_PlainObjectBase<Eigen::Matrix<double,_45,_1,_0,_45,_1>_>.
                             m_storage.m_data.array[0x16];
      dStack_33a0 = Mfactor * (this->m_MassMatrix).
                              super_PlainObjectBase<Eigen::Matrix<double,_45,_1,_0,_45,_1>_>.
                              m_storage.m_data.array[0x17];
      local_3398 = Mfactor * (this->m_MassMatrix).
                             super_PlainObjectBase<Eigen::Matrix<double,_45,_1,_0,_45,_1>_>.
                             m_storage.m_data.array[0x18];
      dStack_3390 = Mfactor * (this->m_MassMatrix).
                              super_PlainObjectBase<Eigen::Matrix<double,_45,_1,_0,_45,_1>_>.
                              m_storage.m_data.array[0x19];
      local_3388 = Mfactor * (this->m_MassMatrix).
                             super_PlainObjectBase<Eigen::Matrix<double,_45,_1,_0,_45,_1>_>.
                             m_storage.m_data.array[0x1a];
      dStack_3380 = Mfactor * (this->m_MassMatrix).
                              super_PlainObjectBase<Eigen::Matrix<double,_45,_1,_0,_45,_1>_>.
                              m_storage.m_data.array[0x1b];
      local_3378 = Mfactor * (this->m_MassMatrix).
                             super_PlainObjectBase<Eigen::Matrix<double,_45,_1,_0,_45,_1>_>.
                             m_storage.m_data.array[0x1c];
      dStack_3370 = Mfactor * (this->m_MassMatrix).
                              super_PlainObjectBase<Eigen::Matrix<double,_45,_1,_0,_45,_1>_>.
                              m_storage.m_data.array[0x1d];
      local_3368 = Mfactor * (this->m_MassMatrix).
                             super_PlainObjectBase<Eigen::Matrix<double,_45,_1,_0,_45,_1>_>.
                             m_storage.m_data.array[0x1e];
      dStack_3360 = Mfactor * (this->m_MassMatrix).
                              super_PlainObjectBase<Eigen::Matrix<double,_45,_1,_0,_45,_1>_>.
                              m_storage.m_data.array[0x1f];
      local_3358 = Mfactor * (this->m_MassMatrix).
                             super_PlainObjectBase<Eigen::Matrix<double,_45,_1,_0,_45,_1>_>.
                             m_storage.m_data.array[0x20];
      dStack_3350 = Mfactor * (this->m_MassMatrix).
                              super_PlainObjectBase<Eigen::Matrix<double,_45,_1,_0,_45,_1>_>.
                              m_storage.m_data.array[0x21];
      local_3348 = Mfactor * (this->m_MassMatrix).
                             super_PlainObjectBase<Eigen::Matrix<double,_45,_1,_0,_45,_1>_>.
                             m_storage.m_data.array[0x22];
      dStack_3340 = Mfactor * (this->m_MassMatrix).
                              super_PlainObjectBase<Eigen::Matrix<double,_45,_1,_0,_45,_1>_>.
                              m_storage.m_data.array[0x23];
      local_3338 = Mfactor * (this->m_MassMatrix).
                             super_PlainObjectBase<Eigen::Matrix<double,_45,_1,_0,_45,_1>_>.
                             m_storage.m_data.array[0x24];
      dStack_3330 = Mfactor * (this->m_MassMatrix).
                              super_PlainObjectBase<Eigen::Matrix<double,_45,_1,_0,_45,_1>_>.
                              m_storage.m_data.array[0x25];
      local_3328 = Mfactor * (this->m_MassMatrix).
                             super_PlainObjectBase<Eigen::Matrix<double,_45,_1,_0,_45,_1>_>.
                             m_storage.m_data.array[0x26];
      dStack_3320 = Mfactor * (this->m_MassMatrix).
                              super_PlainObjectBase<Eigen::Matrix<double,_45,_1,_0,_45,_1>_>.
                              m_storage.m_data.array[0x27];
      local_3318 = Mfactor * (this->m_MassMatrix).
                             super_PlainObjectBase<Eigen::Matrix<double,_45,_1,_0,_45,_1>_>.
                             m_storage.m_data.array[0x28];
      dStack_3310 = Mfactor * (this->m_MassMatrix).
                              super_PlainObjectBase<Eigen::Matrix<double,_45,_1,_0,_45,_1>_>.
                              m_storage.m_data.array[0x29];
      local_3308 = Mfactor * (this->m_MassMatrix).
                             super_PlainObjectBase<Eigen::Matrix<double,_45,_1,_0,_45,_1>_>.
                             m_storage.m_data.array[0x2a];
      dStack_3300 = Mfactor * (this->m_MassMatrix).
                              super_PlainObjectBase<Eigen::Matrix<double,_45,_1,_0,_45,_1>_>.
                              m_storage.m_data.array[0x2b];
      local_32f8 = Mfactor * (this->m_MassMatrix).
                             super_PlainObjectBase<Eigen::Matrix<double,_45,_1,_0,_45,_1>_>.
                             m_storage.m_data.array[0x2c];
      lVar20 = 0x10;
      lVar10 = 8;
      lVar17 = -0xfffffff0;
      uVar6 = 0;
      lVar11 = 0;
      uVar14 = 0;
      do {
        pdVar1 = (H->
                 super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                 ).
                 super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
                 .
                 super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                 .m_data;
        lVar13 = (H->
                 super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                 ).
                 super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
                 .
                 super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                 .m_rows.m_value;
        lVar2 = (H->
                super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                ).
                super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
                .
                super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                .m_cols.m_value;
        lVar15 = (H->
                 super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                 ).m_stride.m_outer.m_value;
        iVar7 = 9;
        lVar16 = 2;
        uVar12 = 0;
        do {
          if (uVar12 < uVar14) {
            uVar19 = (((int)uVar12 + -8) * iVar7 + 0x48U >> 1) + (int)uVar14;
          }
          else {
            uVar19 = ((uint)(uVar6 >> 1) & 0x7fffffff) + (int)uVar12;
          }
          if (0x2c < uVar19) {
            __assert_fail("index >= 0 && index < size()",
                          "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x1ab,
                          "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, 45, 1>, 1>::operator()(Index) [Derived = Eigen::Matrix<double, 45, 1>, Level = 1]"
                         );
          }
          if ((lVar13 <= (long)(uVar14 * 3)) || (lVar2 <= lVar16 + -2)) {
LAB_00740037:
            __assert_fail("row >= 0 && row < rows() && col >= 0 && col < cols()",
                          "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x16f,
                          "Scalar &Eigen::DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double, -1, -1, 1>>, 1>::operator()(Index, Index) [Derived = Eigen::Ref<Eigen::Matrix<double, -1, -1, 1>>, Level = 1]"
                         );
          }
          dVar22 = (&local_3458)[uVar19] + (double)local_34e8[uVar12].m_value;
          *(double *)((long)pdVar1 + lVar16 * 8 + lVar15 * lVar11 + -0x10) =
               dVar22 + *(double *)((long)pdVar1 + lVar16 * 8 + lVar15 * lVar11 + -0x10);
          if ((lVar13 <= (long)(uVar14 * 3 + 1)) ||
             (((lVar2 <= lVar16 + -1 ||
               (*(double *)((long)pdVar1 + lVar16 * 8 + lVar15 * lVar10 + -8) =
                     dVar22 + *(double *)((long)pdVar1 + lVar16 * 8 + lVar15 * lVar10 + -8),
               lVar13 <= (long)(uVar14 * 3 + 2))) || (lVar2 <= lVar16)))) goto LAB_00740037;
          *(double *)((long)pdVar1 + lVar16 * 8 + lVar15 * lVar20) =
               dVar22 + *(double *)((long)pdVar1 + lVar16 * 8 + lVar15 * lVar20);
          uVar12 = uVar12 + 1;
          iVar7 = iVar7 + -1;
          lVar16 = lVar16 + 3;
        } while (lVar16 != 0x1d);
        uVar14 = uVar14 + 1;
        lVar20 = lVar20 + 0x18;
        lVar10 = lVar10 + 0x18;
        lVar11 = lVar11 + 0x18;
        local_34e8 = local_34e8 + 9;
        uVar6 = uVar6 + lVar17;
        lVar17 = lVar17 + -2;
        if (uVar14 == 9) {
          return;
        }
      } while( true );
    }
    __function = 
    "void Eigen::PlainObjectBase<Eigen::Matrix<double, 9, 9, 1>>::resize(Index, Index) [Derived = Eigen::Matrix<double, 9, 9, 1>]"
    ;
  }
  else {
    __function = 
    "void Eigen::PlainObjectBase<Eigen::Matrix<double, 9, 81, 0>>::resize(Index, Index) [Derived = Eigen::Matrix<double, 9, 81, 0>]"
    ;
  }
  __assert_fail("(!(RowsAtCompileTime!=Dynamic) || (rows==RowsAtCompileTime)) && (!(ColsAtCompileTime!=Dynamic) || (cols==ColsAtCompileTime)) && (!(RowsAtCompileTime==Dynamic && MaxRowsAtCompileTime!=Dynamic) || (rows<=MaxRowsAtCompileTime)) && (!(ColsAtCompileTime==Dynamic && MaxColsAtCompileTime!=Dynamic) || (cols<=MaxColsAtCompileTime)) && rows>=0 && cols>=0 && \"Invalid sizes when resizing a matrix or array.\""
                ,"/usr/include/eigen3/Eigen/src/Core/PlainObjectBase.h",0x115,__function);
}

Assistant:

void ChElementBeamANCF_3333::ComputeInternalJacobianPreInt(ChMatrixRef& H,
                                                           double Kfactor,
                                                           double Rfactor,
                                                           double Mfactor) {
    // Calculate the Jacobian of the generalize internal force vector using the "Pre-Integration" style of method
    // assuming a linear viscoelastic material model (single term damping model).  For this style of method, the
    // components of the generalized internal force vector and its Jacobian that need to be integrated across the volume
    // are calculated once prior to the start of the simulation.  Since computationally expensive quantities are
    // required for both the generalized internal force vector and its Jacobian, these values were cached for reuse
    // during this Jacobian calculation.

    Matrix3xN e_bar;
    Matrix3xN e_bar_dot;

    CalcCoordMatrix(e_bar);
    CalcCoordDerivMatrix(e_bar_dot);

    // Build the [9 x NSF^2] matrix containing the combined scaled nodal coordinates and their time derivatives.
    Matrix3xN temp = (Kfactor + m_Alpha * Rfactor) * e_bar + (m_Alpha * Kfactor) * e_bar_dot;
    ChMatrixNM<double, 1, NSF> tempRow0 = temp.template block<1, NSF>(0, 0);
    ChMatrixNM<double, 1, NSF> tempRow1 = temp.template block<1, NSF>(1, 0);
    ChMatrixNM<double, 1, NSF> tempRow2 = temp.template block<1, NSF>(2, 0);
    ChMatrixNMc<double, 9, NSF * NSF> PI2;

    for (unsigned int v = 0; v < NSF; v++) {
        PI2.template block<3, NSF>(0, NSF * v) = e_bar.template block<3, 1>(0, v) * tempRow0;
        PI2.template block<3, NSF>(3, NSF * v) = e_bar.template block<3, 1>(0, v) * tempRow1;
        PI2.template block<3, NSF>(6, NSF * v) = e_bar.template block<3, 1>(0, v) * tempRow2;
    }

    // Calculate the matrix containing the dense part of the Jacobian matrix in a reordered form. This is then reordered
    // from its [9 x NSF^2] form into its required [3*NSF x 3*NSF] form
    ChMatrixNMc<double, 9, NSF* NSF> K2 = -PI2 * m_O2;

    for (unsigned int k = 0; k < NSF; k++) {
        for (unsigned int f = 0; f < NSF; f++) {
            H.block<3, 1>(3 * k, 3 * f) = K2.template block<3, 1>(0, NSF * f + k);
            H.block<3, 1>(3 * k, 3 * f + 1) = K2.template block<3, 1>(3, NSF * f + k);
            H.block<3, 1>(3 * k, 3 * f + 2) = K2.template block<3, 1>(6, NSF * f + k);
        }
    }

    // Add in the sparse (blocks times the 3x3 identity matrix) component of the Jacobian that was already calculated as
    // part of the generalized internal force calculations as well as the Mass Matrix which is stored in compact upper
    // triangular form
    MatrixNxN K_K13Compact = -Kfactor * m_K13Compact;
    ChVectorN<double, (NSF * (NSF + 1)) / 2> ScaledMassMatrix = Mfactor * m_MassMatrix;

    for (unsigned int i = 0; i < NSF; i++) {
        for (unsigned int j = 0; j < NSF; j++) {
            unsigned int idx;
            // Convert from a (i,j) index to a linear index into the Mass Matrix in Compact Upper Triangular Form
            // https://math.stackexchange.com/questions/2134011/conversion-of-upper-triangle-linear-index-from-index-on-symmetrical-array
            if (j >= i) {
                idx = (NSF * (NSF - 1) - (NSF - i) * (NSF - i - 1)) / 2 + j;
            } else {
                idx = (NSF * (NSF - 1) - (NSF - j) * (NSF - j - 1)) / 2 + i;
            }

            double d = ScaledMassMatrix(idx) + K_K13Compact(i, j);
            H(3 * i, 3 * j) += d;
            H(3 * i + 1, 3 * j + 1) += d;
            H(3 * i + 2, 3 * j + 2) += d;
        }
    }
}